

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O3

void __thiscall
cs::stack_type<std::__cxx11::string,std::allocator>::push<std::__cxx11::string_const&>
          (stack_type<std::__cxx11::string,std::allocator> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  string *psVar1;
  pointer pcVar2;
  error *this_00;
  string local_38;
  
  psVar1 = *(string **)(this + 8);
  if ((long)psVar1 - *(long *)this >> 5 != *(long *)(this + 0x20)) {
    *(string **)(this + 8) = psVar1 + 0x20;
    *(string **)psVar1 = psVar1 + 0x10;
    pcVar2 = (args->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>(psVar1,pcVar2,pcVar2 + args->_M_string_length);
    return;
  }
  this_00 = (error *)__cxa_allocate_exception(0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"E000I","");
  cov::error::error(this_00,&local_38);
  __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

inline void push(ArgsT &&...args)
		{
			if (full())
				throw cov::error("E000I");
			::new(m_current++) T(std::forward<ArgsT>(args)...);
		}